

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estimatedplane.cc
# Opt level: O0

void __thiscall
gmath::EstimatedPlane::EstimatedPlane(EstimatedPlane *this,Vector3d *p0,Vector3d *p1,Vector3d *p2)

{
  double *pdVar1;
  SVector<double,_3> *in_RSI;
  SVector<double,_3> *in_RDI;
  double dVar2;
  Vector3d N;
  Vector3d v;
  Vector3d u;
  SVector<double,_3> *in_stack_ffffffffffffffa0;
  SVector<double,_3> *in_stack_ffffffffffffffa8;
  SVector<double,_3> *a;
  
  in_RDI->v[2] = 0.0;
  in_RDI->v[1] = 0.0;
  in_RDI->v[0] = 0.0;
  in_RDI[2].v[1] = 0.0;
  in_RDI[2].v[0] = 0.0;
  in_RDI[1].v[2] = 0.0;
  in_RDI[1].v[1] = 0.0;
  in_RDI[1].v[0] = 0.0;
  *(undefined4 *)(in_RDI[3].v + 2) = 0;
  a = in_RDI;
  dVar2 = std::numeric_limits<double>::infinity();
  in_RDI[3].v[1] = dVar2;
  in_RDI[3].v[0] = dVar2;
  in_RDI[2].v[2] = dVar2;
  SVector<double,_3>::operator-(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  SVector<double,_3>::operator-(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  cross<double>(a,in_RSI);
  pdVar1 = SVector<double,_3>::operator[]((SVector<double,_3> *)&stack0xffffffffffffff98,2);
  if ((ABS(*pdVar1) != 0.0) || (NAN(ABS(*pdVar1)))) {
    pdVar1 = SVector<double,_3>::operator[]((SVector<double,_3> *)&stack0xffffffffffffff98,2);
    SVector<double,_3>::operator/=((SVector<double,_3> *)&stack0xffffffffffffff98,*pdVar1);
    pdVar1 = SVector<double,_3>::operator[]((SVector<double,_3> *)&stack0xffffffffffffff98,0);
    in_RDI[2].v[2] = -*pdVar1;
    pdVar1 = SVector<double,_3>::operator[]((SVector<double,_3> *)&stack0xffffffffffffff98,1);
    in_RDI[3].v[0] = -*pdVar1;
    dVar2 = SVector<double,_3>::operator*(in_RSI,(SVector<double,_3> *)&stack0xffffffffffffff98);
    in_RDI[3].v[1] = dVar2;
  }
  return;
}

Assistant:

EstimatedPlane::EstimatedPlane(const Vector3d &p0, const Vector3d &p1, const Vector3d &p2)
{
  sx=sy=sz=0;
  sxx=sxy=sxz=syy=syz=0;
  n=0;

  a=b=c=std::numeric_limits<double>::infinity();

  Vector3d u=p1-p0;
  Vector3d v=p2-p0;
  Vector3d N=gmath::cross(u, v);

  if (fabs(N[2]) != 0)
  {
    N/=N[2];
    a=-N[0];
    b=-N[1];
    c=p0*N;
  }
}